

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O2

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,BinaryOperatorExpression *expression)

{
  ostream *poVar1;
  bool bVar2;
  bool bVar3;
  OperatorChar OVar4;
  Expression *pEVar5;
  BinaryOperatorExpression *expression_local;
  OperatorChar local_8c;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  local_68._8_8_ = &expression_local;
  local_50 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:56:3)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:56:3)>
             ::_M_manager;
  expression_local = expression;
  local_68._M_unused._M_object = this;
  pEVar5 = BinaryOperatorExpression::leftHandSide(expression);
  bVar2 = PredicateVisitor::apply((ExpressionPredicate *)&local_68,pEVar5);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_70 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:60:3)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:60:3)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  local_88._8_8_ = &expression_local;
  pEVar5 = BinaryOperatorExpression::rightHandSide(expression_local);
  bVar3 = PredicateVisitor::apply((ExpressionPredicate *)&local_88,pEVar5);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  if (bVar2) {
    std::operator<<(this->mStream,"(");
    pEVar5 = BinaryOperatorExpression::leftHandSide(expression_local);
    (*pEVar5->_vptr_Expression[2])(pEVar5,this,expression_local);
    std::operator<<(this->mStream,")");
  }
  else {
    pEVar5 = BinaryOperatorExpression::leftHandSide(expression_local);
    (*pEVar5->_vptr_Expression[2])(pEVar5,this,expression_local);
  }
  OVar4 = BinaryOperatorExpression::op(expression_local);
  local_48._M_dataplus._M_p._0_2_ = OVar4._0_2_;
  local_48._M_dataplus._M_p._2_1_ = OVar4.mOp2;
  OperatorChar::OperatorChar(&local_8c,'^');
  bVar2 = OperatorChar::operator!=((OperatorChar *)&local_48,&local_8c);
  if (bVar2) {
    std::operator<<(this->mStream," ");
  }
  poVar1 = this->mStream;
  OVar4 = BinaryOperatorExpression::op(expression_local);
  local_8c._0_2_ = OVar4._0_2_;
  local_8c.mOp2 = OVar4.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_48,&local_8c);
  std::operator<<(poVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    std::operator<<(this->mStream," ");
  }
  if (bVar3) {
    std::operator<<(this->mStream,"(");
    pEVar5 = BinaryOperatorExpression::rightHandSide(expression_local);
    (*pEVar5->_vptr_Expression[2])(pEVar5,this,expression_local);
    std::operator<<(this->mStream,")");
  }
  else {
    pEVar5 = BinaryOperatorExpression::rightHandSide(expression_local);
    (*pEVar5->_vptr_Expression[2])(pEVar5,this,expression_local);
  }
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, BinaryOperatorExpression* expression) {
	auto needLeftSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->leftHandSide());

	auto needRightSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->rightHandSide());

	if (needLeftSideParentheses) {
		mStream << "(";
	}

	expression->leftHandSide()->accept(*this, expression);

	if (needLeftSideParentheses) {
		mStream << ")";
	}

	bool addSpaces = expression->op() != OperatorChar('^');

	if (addSpaces) {
		mStream << " ";
	}

	mStream << expression->op().toString();

	if (addSpaces) {
		mStream << " ";
	}

	if (needRightSideParentheses) {
		mStream << "(";
	}

	expression->rightHandSide()->accept(*this, expression);

	if (needRightSideParentheses) {
		mStream << ")";
	}
}